

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O0

void fctkern__log_warn(fctkern_t *nk,char *warn)

{
  size_t sVar1;
  fct_logger_i *logger_00;
  fct_logger_i *logger;
  size_t num_itemslogger;
  size_t item_ilogger;
  char *warn_local;
  fctkern_t *nk_local;
  
  if (nk == (fctkern_t *)0x0) {
    __assert_fail("nk != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x959
                  ,"void fctkern__log_warn(fctkern_t *, const char *)");
  }
  if (warn == (char *)0x0) {
    __assert_fail("warn != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x95a
                  ,"void fctkern__log_warn(fctkern_t *, const char *)");
  }
  if (nk != (fctkern_t *)0xfffffffffffffe68) {
    sVar1 = fct_nlist__size(&nk->logger_list);
    for (num_itemslogger = 0; num_itemslogger != sVar1; num_itemslogger = num_itemslogger + 1) {
      logger_00 = (fct_logger_i *)fct_nlist__at(&nk->logger_list,num_itemslogger);
      fct_logger__on_warn(logger_00,warn);
    }
  }
  return;
}

Assistant:

static void
fctkern__log_warn(fctkern_t *nk, char const *warn)
{
    FCT_ASSERT( nk != NULL );
    FCT_ASSERT( warn != NULL );
    FCT_NLIST_FOREACH_BGN(fct_logger_i*, logger, &(nk->logger_list))
    {
        fct_logger__on_warn(logger, warn);
    }
    FCT_NLIST_FOREACH_END();
}